

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::TreeEnsembleParameters::_InternalParse
          (TreeEnsembleParameters *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  int iVar2;
  Rep *pRVar3;
  bool bVar4;
  TreeEnsembleParameters_TreeNode *obj;
  MessageLite *msg;
  uint uVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  double *ptr_00;
  char cVar7;
  uint uVar8;
  pair<const_char_*,_unsigned_int> pVar9;
  pair<const_char_*,_unsigned_long> pVar10;
  double *local_40;
  InternalMetadata *local_38;
  
  local_40 = (double *)ptr;
  bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
  if (!bVar4) {
    local_38 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *(byte *)local_40;
      uVar8 = (uint)bVar1;
      ptr_00 = (double *)((long)local_40 + 1);
      if ((char)bVar1 < '\0') {
        uVar8 = ((uint)bVar1 + (uint)*(byte *)ptr_00 * 0x80) - 0x80;
        if ((char)*(byte *)ptr_00 < '\0') {
          pVar9 = google::protobuf::internal::ReadTagFallback((char *)local_40,uVar8);
          ptr_00 = (double *)pVar9.first;
          uVar8 = pVar9.second;
        }
        else {
          ptr_00 = (double *)((long)local_40 + 2);
        }
      }
      uVar5 = uVar8 >> 3;
      cVar7 = (char)uVar8;
      local_40 = ptr_00;
      if (uVar5 == 3) {
        if (cVar7 != '\x1a') {
          if ((uVar8 & 0xff) != 0x19) goto LAB_002c6f0f;
          _internal_add_basepredictionvalue(this,*ptr_00);
          local_40 = local_40 + 1;
          goto LAB_002c6f4d;
        }
        local_40 = (double *)
                   google::protobuf::internal::PackedDoubleParser
                             (&this->basepredictionvalue_,(char *)ptr_00,ctx);
LAB_002c6f48:
        if (local_40 == (double *)0x0) {
          return (char *)0x0;
        }
      }
      else if (uVar5 == 2) {
        if (cVar7 != '\x10') goto LAB_002c6f0f;
        uVar6 = (ulong)(char)*(byte *)ptr_00;
        local_40 = (double *)((long)ptr_00 + 1);
        if ((long)uVar6 < 0) {
          uVar8 = ((uint)*(byte *)local_40 * 0x80 + (uint)*(byte *)ptr_00) - 0x80;
          if ((char)*(byte *)local_40 < '\0') {
            local_40 = ptr_00;
            pVar10 = google::protobuf::internal::VarintParseSlow64((char *)ptr_00,uVar8);
            local_40 = (double *)pVar10.first;
            this->numpredictiondimensions_ = pVar10.second;
            goto LAB_002c6f48;
          }
          uVar6 = (ulong)uVar8;
          local_40 = (double *)((long)ptr_00 + 2);
        }
        this->numpredictiondimensions_ = uVar6;
      }
      else {
        if ((uVar5 != 1) || (cVar7 != '\n')) {
LAB_002c6f0f:
          if ((uVar8 == 0) || ((uVar8 & 7) == 4)) {
            if (ptr_00 == (double *)0x0) {
              return (char *)0x0;
            }
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar8 - 1;
            return (char *)ptr_00;
          }
          if ((local_38->ptr_ & 1U) == 0) {
            unknown = google::protobuf::internal::InternalMetadata::
                      mutable_unknown_fields_slow<std::__cxx11::string>(local_38);
          }
          else {
            unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((local_38->ptr_ & 0xfffffffffffffffcU) + 8);
          }
          local_40 = (double *)
                     google::protobuf::internal::UnknownFieldParse
                               (uVar8,unknown,(char *)local_40,ctx);
          goto LAB_002c6f48;
        }
        local_40 = (double *)((long)ptr_00 + -1);
        do {
          local_40 = (double *)((long)local_40 + 1);
          pRVar3 = (this->nodes_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar3 == (Rep *)0x0) {
LAB_002c6e43:
            obj = google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::TreeEnsembleParameters_TreeNode>
                            ((this->nodes_).super_RepeatedPtrFieldBase.arena_);
            msg = (MessageLite *)
                  google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                            (&(this->nodes_).super_RepeatedPtrFieldBase,obj);
          }
          else {
            iVar2 = (this->nodes_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar3->allocated_size <= iVar2) goto LAB_002c6e43;
            (this->nodes_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            msg = (MessageLite *)pRVar3->elements[iVar2];
          }
          local_40 = (double *)
                     google::protobuf::internal::ParseContext::ParseMessage
                               (ctx,msg,(char *)local_40);
          if (local_40 == (double *)0x0) {
            return (char *)0x0;
          }
        } while ((local_40 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                (*(char *)local_40 == '\n'));
      }
LAB_002c6f4d:
      bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
    } while (!bVar4);
  }
  return (char *)local_40;
}

Assistant:

const char* TreeEnsembleParameters::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated .CoreML.Specification.TreeEnsembleParameters.TreeNode nodes = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_nodes(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else
          goto handle_unusual;
        continue;
      // uint64 numPredictionDimensions = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          numpredictiondimensions_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated double basePredictionValue = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedDoubleParser(_internal_mutable_basepredictionvalue(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<uint8_t>(tag) == 25) {
          _internal_add_basepredictionvalue(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr));
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}